

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrappeTorsionType.hpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *os,TrappeTorsionType *ttt)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"This TrappeTorsionType has below form:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(ttt->c0_);
  std::operator<<(poVar1," + ");
  poVar1 = std::ostream::_M_insert<double>(ttt->c1_);
  poVar1 = std::operator<<(poVar1,"*(1+cos(phi))");
  std::operator<<(poVar1," + ");
  poVar1 = std::ostream::_M_insert<double>(ttt->c2_);
  poVar1 = std::operator<<(poVar1,"*(1-cos(2*phi))");
  std::operator<<(poVar1," + ");
  poVar1 = std::ostream::_M_insert<double>(ttt->c3_);
  poVar1 = std::operator<<(poVar1,"*(1+cos(3*phi))");
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, TrappeTorsionType& ttt) {
    os << "This TrappeTorsionType has below form:" << std::endl;
    os << ttt.c0_ << " + " << ttt.c1_ << "*(1+cos(phi))"
       << " + " << ttt.c2_ << "*(1-cos(2*phi))"
       << " + " << ttt.c3_ << "*(1+cos(3*phi))" << std::endl;
    return os;
  }